

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointTriface.h
# Opt level: O2

void __thiscall chrono::fea::ChTriangleOfXYZnodes::~ChTriangleOfXYZnodes(ChTriangleOfXYZnodes *this)

{
  ~ChTriangleOfXYZnodes(this);
  ::operator_delete(this,0x38);
  return;
}

Assistant:

class ChApi ChTriangleOfXYZnodes : public ChVariableTupleCarrier_3vars<3, 3, 3> {
  public:
    std::shared_ptr<fea::ChNodeFEAxyz> mnodeB1;
    std::shared_ptr<fea::ChNodeFEAxyz> mnodeB2;
    std::shared_ptr<fea::ChNodeFEAxyz> mnodeB3;

    virtual ChVariables* GetVariables1() override { return &mnodeB1->Variables(); }
    virtual ChVariables* GetVariables2() override { return &mnodeB2->Variables(); }
    virtual ChVariables* GetVariables3() override { return &mnodeB3->Variables(); }
}